

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags_storage.hpp
# Opt level: O2

void __thiscall
tfl::detail::flags_storage<3UL>::flags_storage<char>
          (flags_storage<3UL> *this,char *src,size_t n,char zero,char one)

{
  invalid_argument *this_00;
  size_t sVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  
  sVar4 = 3;
  if (n < 3) {
    sVar4 = n;
  }
  (this->m_data)._M_elems[0] = '\0';
  pcVar2 = src + n;
  bVar3 = 0;
  sVar1 = 0;
  do {
    pcVar2 = pcVar2 + -1;
    if (sVar4 == sVar1) {
      return;
    }
    if (*pcVar2 == one) {
      bVar3 = bVar3 | '\x01' << ((byte)sVar1 & 0x1f);
      (this->m_data)._M_elems[0] = bVar3;
    }
    else if (*pcVar2 != zero) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Char is not zero or one");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

explicit flags_storage(CharT const* src, size_t n, CharT zero, CharT one)
    {
        reset();
        auto it = src + n;
        for (size_t k = 0; k < n && k < N; ++k) {
            CharT const ch = *--it;
            if (ch == one)
                set_bit(k, true);
            else if (ch != zero)
                throw std::invalid_argument("Char is not zero or one");
        }
    }